

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureBarrierSameTexelRWBase::updateTextureData(TextureBarrierSameTexelRWBase *this)

{
  GLuint *pGVar1;
  GLuint x;
  uint x_00;
  long lVar2;
  GLuint y;
  uint y_00;
  
  for (x_00 = 0; x_00 < (this->super_TextureBarrierBasicOutline).m_width; x_00 = x_00 + 1) {
    for (y_00 = 0; lVar2 = 0x17, y_00 < (this->super_TextureBarrierBasicOutline).m_height;
        y_00 = y_00 + 1) {
      for (; lVar2 != 0x1f; lVar2 = lVar2 + 1) {
        pGVar1 = TextureBarrierBasicOutline::texel
                           (&this->super_TextureBarrierBasicOutline,
                            (GLuint *)
                            (&(this->super_TextureBarrierBasicOutline).super_TextureBarrierBaseTest.
                              super_TestCase.super_TestCase.super_TestNode._vptr_TestNode)[lVar2],
                            x_00,y_00);
        *pGVar1 = *pGVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

virtual void updateTextureData()
	{
		for (GLuint x = 0; x < m_width; ++x)
			for (GLuint y = 0; y < m_height; ++y)
			{
				for (GLuint i = 0; i < NUM_TEXTURES; ++i)
				{
					texel(m_reference[i], x, y)++;
				}
			}
	}